

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# VarianceSwapsHestonAnalyticalPricer.cpp
# Opt level: O3

complex<double> __thiscall
VarianceSwapsHestonAnalyticalPricer::functionD
          (VarianceSwapsHestonAnalyticalPricer *this,double tau,double omega)

{
  undefined1 auVar1 [16];
  double dVar2;
  undefined8 uVar3;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Da_01;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Db_01;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  undefined1 auVar9 [16];
  complex<double> cVar10;
  undefined8 local_a8;
  undefined1 local_38 [16];
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  dVar4 = omega;
  dVar2 = HestonModel::getVolOfVol(this->hestonModel_);
  aTerm(this,omega);
  dVar5 = dVar4;
  bTerm(this,omega);
  local_a8 = (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00);
  dVar6 = dVar5;
  gTerm(this,omega);
  dVar2 = dVar2 * dVar2;
  dVar7 = -dVar5 * tau;
  dVar8 = dVar7;
  local_18 = cexp(-local_a8 * tau);
  local_10 = -dVar8;
  local_18 = 1.0 - local_18;
  auVar9._0_8_ = (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) - local_a8;
  auVar9._8_8_ = dVar4 - dVar5;
  auVar1._8_4_ = SUB84(dVar2,0);
  auVar1._0_8_ = dVar2;
  auVar1._12_4_ = (int)((ulong)dVar2 >> 0x20);
  local_38 = divpd(auVar9,auVar1);
  std::complex<double>::operator*=((complex<double> *)local_38,(complex<double> *)&local_18);
  auVar1 = local_38;
  uVar3 = local_38._8_8_;
  local_28 = cexp(-local_a8 * tau);
  local_20 = dVar7;
  local_38._0_8_ = CONCAT44(extraout_XMM0_Db_01,extraout_XMM0_Da_01);
  local_38._8_8_ = dVar6;
  std::complex<double>::operator*=((complex<double> *)local_38,(complex<double> *)&local_28);
  cVar10._M_value =
       (_ComplexT)__divdc3(auVar1._0_4_,uVar3,1.0 - (double)local_38._0_8_,-(double)local_38._8_8_);
  return (complex<double>)cVar10._M_value;
}

Assistant:

std::complex<double> VarianceSwapsHestonAnalyticalPricer::
functionD(double tau, double omega) const {
    double sigma = hestonModel_->getVolOfVol();
    std::complex<double> a = aTerm(omega), 
                         b = bTerm(omega),
                         g = gTerm(omega);
    std::complex<double> D_init = (a-b)/(sigma*sigma); //definition during class
    return D_init*(1.-std::exp(-b*tau))/(1.-g*std::exp(-b*tau)); // in class
    // return D_init*(1.-std::exp(b*tau))/(1.-g*std::exp(b*tau)); // in PDF
}